

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContactAngle2.cpp
# Opt level: O3

void __thiscall OpenMD::ContactAngle2::doFrame(ContactAngle2 *this,int param_1)

{
  SelectionManager *this_00;
  undefined8 *puVar1;
  pointer pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  iterator __position;
  int iVar7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  undefined4 extraout_EAX;
  uint uVar11;
  value_type_conflict1 *__val;
  StuntDouble *pSVar12;
  uint i_1;
  ulong uVar14;
  ulong uVar15;
  pointer pvVar16;
  pointer pVVar17;
  undefined4 uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  long lVar23;
  bool bVar24;
  int iVar25;
  uint uVar29;
  pointer pdVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double dVar34;
  double dVar35;
  undefined8 uVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  vector<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_> points;
  int i;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  histo;
  DynamicVector<double,_std::allocator<double>_> evals;
  DynamicVector<double,_std::allocator<double>_> evector;
  DynamicRectMatrix<double> evects;
  DynamicRectMatrix<double> mat;
  Eigenvalue<double> eigensystem;
  RealType coeff [3];
  Mat3x3d hmat;
  double local_248;
  double dStack_240;
  vector<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_> local_238;
  int local_21c;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_218;
  double local_1f8;
  double dStack_1f0;
  undefined1 local_1e8 [16];
  vector<double,_std::allocator<double>_> local_1d8;
  DynamicVector<double,_std::allocator<double>_> local_1c0;
  DynamicRectMatrix<double> local_1a8;
  DynamicRectMatrix<double> local_198;
  double local_188;
  double dStack_180;
  RealType local_178;
  double dStack_170;
  double local_160;
  Eigenvalue<double> local_158;
  double local_d8;
  undefined8 uStack_d0;
  double local_c8;
  double dStack_c0;
  RealType local_b8 [4];
  double adStack_98 [4];
  Mat3x3d local_78;
  double **ppdVar13;
  
  Snapshot::getHmat(&local_78,((this->super_SequentialAnalyzer).info_)->sman_->currentSnapshot_);
  local_1e8._8_8_ = 0;
  local_1e8._0_8_ =
       local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][2];
  dVar34 = local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1];
  if (local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] <=
      local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[1][1]) {
    dVar34 = local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
  }
  local_1f8 = (double)this->nRBins_;
  dStack_1f0 = (double)this->nZBins_;
  local_218.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(&local_218,this->nRBins_);
  if (local_218.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_218.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar14 = 0;
    uVar15 = 1;
    pvVar16 = local_218.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::vector<double,_std::allocator<double>_>::resize(pvVar16 + uVar14,this->nZBins_);
      pvVar16 = local_218.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pdVar26 = local_218.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar14].
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      pdVar2 = local_218.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar14].
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_finish;
      if (pdVar26 != pdVar2) {
        memset(pdVar26,0,((long)pdVar2 + (-8 - (long)pdVar26) & 0xfffffffffffffff8U) + 8);
      }
      uVar14 = ((long)local_218.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar16 >> 3) *
               -0x5555555555555555;
      bVar24 = uVar15 <= uVar14;
      lVar23 = uVar14 - uVar15;
      uVar14 = uVar15;
      uVar15 = (ulong)((int)uVar15 + 1);
    } while (bVar24 && lVar23 != 0);
  }
  if ((this->super_SequentialAnalyzer).evaluator1_.isDynamic_ != false) {
    SelectionEvaluator::evaluate
              ((SelectionSet *)&local_158,&(this->super_SequentialAnalyzer).evaluator1_);
    lVar23 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->super_SequentialAnalyzer).seleMan1_.ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar23),
                 (vector<bool,_std::allocator<bool>_> *)(local_158._0_8_ + lVar23));
      lVar23 = lVar23 + 0x28;
    } while (lVar23 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_158);
  }
  local_178 = this->solidZ_;
  local_b8[0] = this->centroidX_;
  local_b8[1] = this->centroidY_;
  this_00 = &(this->super_SequentialAnalyzer).seleMan1_;
  local_b8[2] = local_178;
  pSVar12 = SelectionManager::beginSelected(this_00,&local_21c);
  auVar31._0_8_ =
       ((double)((ulong)local_1f8 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)((ulong)local_1f8 & 0xffffffff | 0x4330000000000000);
  auVar31._8_8_ =
       ((double)((ulong)dStack_1f0 >> 0x20 | 0x4530000000000000) - 1.9342813118337666e+25) +
       (double)((ulong)dStack_1f0 & 0xffffffff | 0x4330000000000000);
  auVar28._8_8_ = local_1e8._0_8_;
  auVar28._0_8_ = dVar34;
  auVar28 = divpd(auVar28,auVar31);
  local_1e8._0_8_ = (double)local_1e8._0_8_ * 0.5;
  while (pSVar12 != (StuntDouble *)0x0) {
    lVar23 = *(long *)((long)&(pSVar12->snapshotMan_->currentSnapshot_->atomData).position.
                              super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + pSVar12->storage_);
    local_238.
    super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         *(pointer *)(lVar23 + 0x10 + (long)pSVar12->localIndex_ * 0x18);
    puVar1 = (undefined8 *)(lVar23 + (long)pSVar12->localIndex_ * 0x18);
    local_238.
    super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)*puVar1;
    local_238.
    super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)puVar1[1];
    local_158._0_8_ = 0.0;
    local_158.d.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_158.d.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar23 = 0;
    do {
      *(double *)(&local_158.n + lVar23 * 2) =
           (double)(&local_238.
                     super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)[lVar23] - local_b8[lVar23];
      lVar23 = lVar23 + 1;
    } while (lVar23 != 3);
    auVar30._0_8_ =
         SQRT((double)local_158.d.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start *
              (double)local_158.d.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start +
              (double)local_158._0_8_ * (double)local_158._0_8_);
    auVar30._8_8_ =
         (double)local_158.d.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish + (double)local_1e8._0_8_;
    auVar31 = divpd(auVar30,auVar28);
    iVar25 = (int)auVar31._0_8_;
    uVar29 = (uint)auVar31._8_8_;
    iVar22 = (int)this->nRBins_;
    iVar7 = (int)this->nZBins_;
    auVar32._0_4_ = -(uint)(iVar25 < iVar22);
    auVar32._4_4_ = -(uint)(iVar25 < iVar22);
    auVar32._8_4_ = -(uint)((int)uVar29 < iVar7);
    auVar32._12_4_ = -(uint)((int)uVar29 < iVar7);
    uVar18 = movmskpd((int)local_238.
                           super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,auVar32);
    if ((byte)(-1 < (int)uVar29 & (byte)uVar18 & (byte)uVar18 >> 1) == 1) {
      pdVar26 = local_218.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar25].
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      pdVar26[uVar29] = pSVar12->mass_ + pdVar26[uVar29];
    }
    pSVar12 = SelectionManager::nextSelected(this_00,&local_21c);
  }
  dStack_240 = auVar28._8_8_;
  local_1f8 = dStack_240;
  dStack_1f0 = dStack_240;
  local_248 = auVar28._0_8_;
  if ((long)local_218.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_218.
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0) {
    uVar14 = ((long)local_218.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_218.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    uVar15 = 0;
    do {
      pdVar26 = local_218.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar15].
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start;
      lVar23 = (long)local_218.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar15].
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar26;
      if (lVar23 != 0) {
        dVar34 = (double)(uVar15 & 0xffffffff) * local_248;
        uVar20 = 0;
        do {
          pdVar26[uVar20] =
               pdVar26[uVar20] *
               (1.66053886 /
               (((local_248 + dVar34) * (local_248 + dVar34) - dVar34 * dVar34) *
               dStack_240 * 3.141592653589793));
          uVar20 = uVar20 + 1;
        } while ((uVar20 & 0xffffffff) < (ulong)(lVar23 >> 3));
      }
      uVar15 = uVar15 + 1;
    } while ((uVar15 & 0xffffffff) <= uVar14 && uVar14 - (uVar15 & 0xffffffff) != 0);
  }
  local_238.
  super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.
  super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.
  super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar14 = this->nZBins_;
  uVar15 = 0;
  do {
    if (this->nRBins_ != 0) {
      pdVar26 = (pointer)(((double)uVar15 + 0.5) * local_1f8 +
                         ((local_178 - this->solidZ_) - (double)local_1e8._0_8_));
      bVar9 = 0;
      uVar20 = 0;
      uVar21 = 0;
      pvVar16 = local_218.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      bVar24 = false;
      do {
        bVar10 = bVar24;
        dVar34 = (pvVar16->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar15];
        bVar9 = this->threshDens_ <= dVar34 | bVar9;
        bVar8 = (bool)(dVar34 <= this->threshDens_ & bVar9);
        if (bVar8) {
          uVar20 = uVar21 & 0xffffffff;
        }
        bVar9 = bVar8 ^ bVar9;
        uVar21 = uVar21 + 1;
        pvVar16 = pvVar16 + 1;
        bVar24 = (bool)(bVar10 | bVar8);
      } while (this->nRBins_ != uVar21);
      if ((bVar10 || bVar8) &&
         (local_158._0_8_ = ((double)(int)uVar20 + 0.5) * local_248,
         local_158.d.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start = pdVar26,
         this->bufferLength_ <= (double)pdVar26 && (double)pdVar26 != this->bufferLength_)) {
        std::vector<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>::
        push_back(&local_238,(value_type *)&local_158);
        uVar14 = this->nZBins_;
      }
    }
    uVar15 = (ulong)((int)uVar15 + 1);
  } while (uVar15 < uVar14);
  local_188 = (local_238.
               super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->data_[0];
  dStack_180 = (local_238.
                super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->data_[1];
  uVar29 = (uint)((ulong)((long)local_238.
                                super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_238.
                               super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4);
  if (1 < (int)uVar29) {
    lVar23 = (ulong)(uVar29 & 0x7fffffff) - 1;
    pVVar17 = local_238.
              super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_188 = local_188 + pVVar17[1].data_[0];
      dStack_180 = dStack_180 + pVVar17[1].data_[1];
      lVar23 = lVar23 + -1;
      pVVar17 = pVVar17 + 1;
    } while (lVar23 != 0);
  }
  DynamicRectMatrix<double>::DynamicRectMatrix(&local_198,4,4);
  dVar34 = 1.0 / (double)(int)uVar29;
  uStack_d0 = 0;
  local_188 = local_188 * dVar34;
  dStack_180 = dStack_180 * dVar34;
  lVar23 = 0;
  do {
    pdVar3 = local_198.data_[lVar23];
    pdVar3[2] = 0.0;
    pdVar3[3] = 0.0;
    *pdVar3 = 0.0;
    pdVar3[1] = 0.0;
    lVar23 = lVar23 + 1;
  } while (lVar23 != 4);
  pdVar3 = *local_198.data_;
  if (0 < (int)uVar29) {
    pdVar4 = local_198.data_[1];
    pdVar5 = local_198.data_[2];
    pdVar6 = local_198.data_[3];
    uVar14 = (ulong)(uVar29 & 0x7fffffff);
    pVVar17 = local_238.
              super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      dVar38 = pVVar17->data_[0];
      dVar39 = pVVar17->data_[1];
      pdVar3[1] = pdVar3[1] + dVar38;
      pdVar3[2] = pdVar3[2] + dVar39;
      dVar37 = dVar38 * dVar38 + dVar39 * dVar39;
      pdVar3[3] = dVar37 + pdVar3[3];
      pdVar4[1] = pdVar4[1] + dVar38 * dVar38;
      pdVar4[2] = pdVar4[2] + dVar38 * dVar39;
      pdVar4[3] = dVar38 * dVar37 + pdVar4[3];
      pdVar5[2] = dVar39 * dVar39 + pdVar5[2];
      pdVar5[3] = dVar39 * dVar37 + pdVar5[3];
      pdVar6[3] = dVar37 * dVar37 + pdVar6[3];
      pVVar17 = pVVar17 + 1;
      uVar14 = uVar14 - 1;
    } while (uVar14 != 0);
  }
  *pdVar3 = (double)(int)uVar29;
  lVar23 = 0;
  do {
    if (lVar23 != 0) {
      pdVar3 = local_198.data_[lVar23];
      lVar19 = 0;
      do {
        pdVar3[lVar19] = local_198.data_[lVar19][lVar23];
        lVar19 = lVar19 + 1;
      } while (lVar23 != lVar19);
    }
    lVar23 = lVar23 + 1;
  } while (lVar23 != 4);
  lVar23 = 0;
  do {
    pdVar3 = local_198.data_[lVar23];
    lVar19 = 0;
    do {
      pdVar4 = pdVar3 + lVar19;
      dVar38 = pdVar4[1];
      pdVar5 = pdVar3 + lVar19;
      *pdVar5 = *pdVar4 * dVar34;
      pdVar5[1] = dVar38 * dVar34;
      lVar19 = lVar19 + 2;
    } while (lVar19 != 4);
    lVar23 = lVar23 + 1;
  } while (lVar23 != 4);
  local_d8 = dVar34;
  JAMA::Eigenvalue<double>::Eigenvalue(&local_158,&local_198);
  DynamicRectMatrix<double>::DynamicRectMatrix(&local_1a8,4,4);
  local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)operator_new(0x20);
  local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + 4;
  local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[2] = 0.0;
  local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[3] = 0.0;
  *local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
   _M_start = 0.0;
  local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[1] = 0.0;
  local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_finish;
  std::vector<double,_std::allocator<double>_>::reserve
            (&local_1d8,
             (long)local_158.d.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_158.d.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  std::vector<double,_std::allocator<double>_>::operator=(&local_1d8,&local_158.d.data_);
  DynamicRectMatrix<double>::operator=((DynamicRectMatrix<double> *)&local_1c0,&local_1a8);
  DynamicRectMatrix<double>::deallocate((DynamicRectMatrix<double> *)&local_1c0);
  DynamicRectMatrix<double>::getColumn(&local_1c0,&local_1a8,0);
  pdVar3 = (double *)
           local_1c0.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[3];
  lVar23 = 0;
  do {
    adStack_98[lVar23] =
         (double)local_1c0.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar23] * (1.0 / (double)pdVar3);
    lVar23 = lVar23 + 1;
  } while (lVar23 != 3);
  iVar22 = 0;
  ppdVar13 = (double **)
             local_1c0.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  dVar38 = adStack_98[1] * -0.5;
  dVar39 = adStack_98[2] * -0.5;
  do {
    uVar18 = SUB84(ppdVar13,0);
    dVar40 = 0.0;
    dVar41 = 0.0;
    dVar37 = 0.0;
    uVar36 = 0;
    if (0 < (int)uVar29) {
      uVar14 = 0;
      local_c8 = dVar38;
      dStack_c0 = dVar39;
      do {
        dVar42 = local_238.
                 super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar14].data_[0] - dVar38;
        dVar43 = local_238.
                 super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar14].data_[1] - dVar39;
        dVar27 = 0.0;
        bVar24 = true;
        dVar35 = dVar42;
        do {
          bVar10 = bVar24;
          dVar27 = dVar27 + dVar35 * dVar35;
          uVar18 = 0;
          bVar24 = false;
          dVar35 = dVar43;
        } while (bVar10);
        if (dVar27 < 0.0) {
          local_1f8 = dVar40;
          dStack_1f0 = dVar41;
          local_178 = dVar42;
          dStack_170 = dVar43;
          local_1e8._0_8_ = dVar37;
          local_1e8._8_8_ = uVar36;
          dVar27 = sqrt(dVar27);
          dVar37 = (double)local_1e8._0_8_;
          uVar36 = local_1e8._8_8_;
          dVar38 = local_c8;
          dVar39 = dStack_c0;
          dVar40 = local_1f8;
          dVar41 = dStack_1f0;
          dVar42 = local_178;
          dVar43 = dStack_170;
          uVar18 = extraout_EAX;
        }
        else {
          dVar27 = SQRT(dVar27);
        }
        if (1e-06 < dVar27) {
          dVar37 = dVar37 + dVar27;
          dVar40 = dVar40 - dVar42 * (1.0 / dVar27);
          dVar41 = dVar41 - dVar43 * (1.0 / dVar27);
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 != (uVar29 & 0x7fffffff));
    }
    dVar37 = dVar37 * local_d8;
    dVar40 = dVar37 * dVar40 * dVar34 + local_188;
    dVar41 = dVar37 * dVar41 * dVar34 + dStack_180;
    auVar33._8_8_ = -(ulong)(ABS(dVar41 - dVar39) <= 1e-06);
    auVar33._0_8_ = -(ulong)(ABS(dVar40 - dVar38) <= 1e-06);
    uVar11 = movmskpd(uVar18,auVar33);
    ppdVar13 = (double **)(ulong)uVar11;
  } while ((uVar11 != 3) && (iVar22 = iVar22 + 1, dVar38 = dVar40, dVar39 = dVar41, iVar22 != 100));
  if (ABS(dVar41) <= dVar37) {
    dVar34 = asin(dVar41 / dVar37);
    local_160 = dVar34 * 57.29577951308232 + 90.0;
  }
  else {
    local_160 = 180.0;
  }
  __position._M_current =
       (this->super_SequentialAnalyzer).values_.super__Vector_base<double,_std::allocator<double>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->super_SequentialAnalyzer).values_.super__Vector_base<double,_std::allocator<double>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              ((vector<double,std::allocator<double>> *)&(this->super_SequentialAnalyzer).values_,
               __position,&local_160);
  }
  else {
    *__position._M_current = local_160;
    (this->super_SequentialAnalyzer).values_.super__Vector_base<double,_std::allocator<double>_>.
    _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  if ((double **)
      local_1c0.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (double **)0x0) {
    operator_delete(local_1c0.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1c0.data_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1c0.data_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  DynamicRectMatrix<double>::deallocate(&local_1a8);
  if (local_158.ort.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.ort.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_158.ort.data_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.ort.data_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  DynamicRectMatrix<double>::deallocate(&local_158.H);
  DynamicRectMatrix<double>::deallocate(&local_158.V);
  if (local_158.e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.e.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_158.e.data_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.e.data_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_158.d.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_158.d.data_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_158.d.data_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_158.d.data_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  DynamicRectMatrix<double>::deallocate(&local_198);
  if (local_238.
      super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_238.
                    super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_238.
                          super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.
                          super__Vector_base<OpenMD::Vector<double,_2U>,_std::allocator<OpenMD::Vector<double,_2U>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_218);
  return;
}

Assistant:

void ContactAngle2::doFrame(int) {
    StuntDouble* sd;
    int i;

    // set up the bins for density analysis

    Mat3x3d hmat = info_->getSnapshotManager()->getCurrentSnapshot()->getHmat();
    RealType len = std::min(hmat(0, 0), hmat(1, 1));
    RealType zLen = hmat(2, 2);

    RealType dr = len / (RealType)nRBins_;
    RealType dz = zLen / (RealType)nZBins_;

    std::vector<std::vector<RealType>> histo;
    histo.resize(nRBins_);
    for (unsigned int i = 0; i < histo.size(); ++i) {
      histo[i].resize(nZBins_);
      std::fill(histo[i].begin(), histo[i].end(), 0.0);
    }

    if (evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }

    Vector3d com(centroidX_, centroidY_, solidZ_);

    // now that we have the centroid, we can make cylindrical density maps
    Vector3d pos;
    RealType r;
    RealType z;

    for (sd = seleMan1_.beginSelected(i); sd != NULL;
         sd = seleMan1_.nextSelected(i)) {
      pos = sd->getPos() - com;

      // r goes from zero upwards
      r = sqrt(pow(pos.x(), 2) + pow(pos.y(), 2));
      // z is possibly symmetric around 0
      z = pos.z();

      int whichRBin = int(r / dr);
      int whichZBin = int((zLen / 2.0 + z) / dz);

      if ((whichRBin < int(nRBins_)) && (whichZBin >= 0) &&
          (whichZBin < int(nZBins_))) {
        histo[whichRBin][whichZBin] += sd->getMass();
      }
    }

    for (unsigned int i = 0; i < histo.size(); ++i) {
      RealType rL       = i * dr;
      RealType rU       = rL + dr;
      RealType volSlice = Constants::PI * dz * ((rU * rU) - (rL * rL));

      for (unsigned int j = 0; j < histo[i].size(); ++j) {
        histo[i][j] *= Constants::densityConvert / volSlice;
      }
    }

    std::vector<Vector<RealType, 2>> points;
    points.clear();

    for (unsigned int j = 0; j < nZBins_; ++j) {
      // The z coordinates were measured relative to the selection
      // center of mass.  However, we're interested in the elevation
      // above the solid surface.  Also, the binning was done around
      // zero with enough bins to cover the zLength of the box:

      RealType thez    = com.z() - solidZ_ - zLen / 2.0 + dz * (j + 0.5);
      bool aboveThresh = false;
      bool foundThresh = false;
      int rloc         = 0;

      for (std::size_t i = 0; i < nRBins_; ++i) {
        if (histo[i][j] >= threshDens_) aboveThresh = true;

        if (aboveThresh && (histo[i][j] <= threshDens_)) {
          rloc        = i;
          foundThresh = true;
          aboveThresh = false;
        }
      }
      if (foundThresh) {
        Vector<RealType, 2> point;
        point[0] = dr * (rloc + 0.5);
        point[1] = thez;

        if (thez > bufferLength_) { points.push_back(point); }
      }
    }

    int numPoints = points.size();

    // Compute the average of the data points.
    Vector<RealType, 2> average = points[0];
    int i0;
    for (i0 = 1; i0 < numPoints; ++i0) {
      average += points[i0];
    }
    RealType invNumPoints = ((RealType)1) / (RealType)numPoints;
    average *= invNumPoints;

    DynamicRectMatrix<RealType> mat(4, 4);
    int row, col;
    for (row = 0; row < 4; ++row) {
      for (col = 0; col < 4; ++col) {
        mat(row, col) = 0.0;
      }
    }
    for (int i = 0; i < numPoints; ++i) {
      RealType x   = points[i][0];
      RealType y   = points[i][1];
      RealType x2  = x * x;
      RealType y2  = y * y;
      RealType xy  = x * y;
      RealType r2  = x2 + y2;
      RealType xr2 = x * r2;
      RealType yr2 = y * r2;
      RealType r4  = r2 * r2;

      mat(0, 1) += x;
      mat(0, 2) += y;
      mat(0, 3) += r2;
      mat(1, 1) += x2;
      mat(1, 2) += xy;
      mat(1, 3) += xr2;
      mat(2, 2) += y2;
      mat(2, 3) += yr2;
      mat(3, 3) += r4;
    }
    mat(0, 0) = (RealType)numPoints;

    for (row = 0; row < 4; ++row) {
      for (col = 0; col < row; ++col) {
        mat(row, col) = mat(col, row);
      }
    }

    for (row = 0; row < 4; ++row) {
      for (col = 0; col < 4; ++col) {
        mat(row, col) *= invNumPoints;
      }
    }

    JAMA::Eigenvalue<RealType> eigensystem(mat);
    DynamicRectMatrix<RealType> evects(4, 4);
    DynamicVector<RealType> evals(4);

    eigensystem.getRealEigenvalues(evals);
    eigensystem.getV(evects);

    DynamicVector<RealType> evector = evects.getColumn(0);
    RealType inv = ((RealType)1) / evector[3];  // beware zero divide
    RealType coeff[3];
    for (row = 0; row < 3; ++row) {
      coeff[row] = inv * evector[row];
    }

    Vector<RealType, 2> center;

    center[0] = -((RealType)0.5) * coeff[1];
    center[1] = -((RealType)0.5) * coeff[2];
    RealType radius =
        sqrt(fabs(center[0] * center[0] + center[1] * center[1] - coeff[0]));

    int i1;
    for (i1 = 0; i1 < 100; ++i1) {
      // Update the iterates.
      Vector<RealType, 2> current = center;

      // Compute average L, dL/da, dL/db.
      RealType lenAverage               = (RealType)0;
      Vector<RealType, 2> derLenAverage = Vector<RealType, 2>(0.0);
      for (i0 = 0; i0 < numPoints; ++i0) {
        Vector<RealType, 2> diff = points[i0] - center;
        RealType length          = diff.length();
        if (length > 1e-6) {
          lenAverage += length;
          RealType invLength = ((RealType)1) / length;
          derLenAverage -= invLength * diff;
        }
      }
      lenAverage *= invNumPoints;
      derLenAverage *= invNumPoints;

      center = average + lenAverage * derLenAverage;
      radius = lenAverage;

      Vector<RealType, 2> diff = center - current;
      if (fabs(diff[0]) <= 1e-6 && fabs(diff[1]) <= 1e-6) { break; }
    }

    RealType zCen  = center[1];
    RealType rDrop = radius;
    RealType ca;

    if (fabs(zCen) > rDrop) {
      ca = 180.0;
    } else {
      ca = 90.0 + asin(zCen / rDrop) * (180.0 / Constants::PI);
    }

    values_.push_back(ca);
  }